

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Object * xt::vector::assocN(Object *__return_storage_ptr__,Vector *v,uint i,Object *val)

{
  uint uVar1;
  uint level;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  element_type *this;
  reference this_00;
  _Vector *p_Var6;
  RuntimeException *this_01;
  double __z;
  allocator local_159;
  string local_158 [32];
  Object local_138;
  shared_ptr<xt::_Vector> local_118;
  shared_ptr<xt::_Vector> local_108;
  undefined1 local_f1;
  shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_> local_f0;
  Object local_e0;
  shared_ptr<xt::_Node> local_c0;
  Node local_b0;
  shared_ptr<xt::_Vector> local_a0;
  undefined1 local_89;
  shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_> local_88;
  shared_ptr<xt::_Node> local_78;
  shared_ptr<xt::_Vector> local_68 [2];
  undefined1 local_48 [8];
  ObjectArray newTail;
  Object *val_local;
  uint i_local;
  Vector *v_local;
  
  peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      v);
  if (i < peVar3->cnt) {
    std::shared_ptr<xt::_Vector>::shared_ptr
              ((shared_ptr<xt::_Vector> *)
               &newTail.
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,v);
    uVar2 = tailoff((Vector *)
                    &newTail.
                     super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
    std::shared_ptr<xt::_Vector>::~shared_ptr
              ((shared_ptr<xt::_Vector> *)
               &newTail.
                super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (i < uVar2) {
      p_Var6 = (_Vector *)operator_new(0x28);
      local_f1 = 1;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      uVar2 = peVar3->cnt;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      uVar1 = peVar3->shift;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      level = peVar3->shift;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      std::shared_ptr<xt::_Node>::shared_ptr(&local_c0,&peVar3->root);
      Object::Object(&local_e0,val);
      doAssoc((vector *)&local_b0,level,&local_c0,i,&local_e0);
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::shared_ptr
                (&local_f0,&peVar3->tail);
      _Vector::_Vector(p_Var6,uVar2,uVar1,&local_b0,&local_f0);
      local_f1 = 0;
      std::shared_ptr<xt::_Vector>::shared_ptr<xt::_Vector,void>(&local_a0,p_Var6);
      Object::Object<xt::_Vector>(__return_storage_ptr__,&local_a0);
      std::shared_ptr<xt::_Vector>::~shared_ptr(&local_a0);
      std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::~shared_ptr(&local_f0)
      ;
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_b0);
      Object::~Object(&local_e0);
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_c0);
    }
    else {
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      peVar4 = std::
               __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->tail);
      sVar5 = std::vector<xt::Object,_std::allocator<xt::Object>_>::size(peVar4);
      new_object_array((xt *)local_48,(uint)sVar5);
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      peVar4 = std::
               __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar3->tail);
      this = std::
             __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
      std::vector<xt::Object,_std::allocator<xt::Object>_>::operator=(this,peVar4);
      peVar4 = std::
               __shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
      this_00 = std::vector<xt::Object,_std::allocator<xt::Object>_>::operator[]
                          (peVar4,(ulong)(i & 0x1f));
      Object::operator=(this_00,val);
      p_Var6 = (_Vector *)operator_new(0x28);
      local_89 = 1;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      uVar2 = peVar3->cnt;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      uVar1 = peVar3->shift;
      peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      std::shared_ptr<xt::_Node>::shared_ptr(&local_78,&peVar3->root);
      std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::shared_ptr
                (&local_88,
                 (shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_> *)local_48);
      _Vector::_Vector(p_Var6,uVar2,uVar1,&local_78,&local_88);
      local_89 = 0;
      std::shared_ptr<xt::_Vector>::shared_ptr<xt::_Vector,void>(local_68,p_Var6);
      Object::Object<xt::_Vector>(__return_storage_ptr__,local_68);
      std::shared_ptr<xt::_Vector>::~shared_ptr(local_68);
      std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::~shared_ptr(&local_88)
      ;
      std::shared_ptr<xt::_Node>::~shared_ptr(&local_78);
      std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::~shared_ptr
                ((shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_> *)local_48);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)v);
    if (i != peVar3->cnt) {
      this_01 = (RuntimeException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"Index out of bounds",&local_159);
      RuntimeException::RuntimeException(this_01,(string *)local_158);
      __cxa_throw(this_01,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    std::shared_ptr<xt::_Vector>::shared_ptr(&local_118,v);
    Object::Object(&local_138,val);
    conj(__z);
    Object::Object<xt::_Vector>(__return_storage_ptr__,&local_108);
    std::shared_ptr<xt::_Vector>::~shared_ptr(&local_108);
    Object::~Object(&local_138);
    std::shared_ptr<xt::_Vector>::~shared_ptr(&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Object assocN(Vector v, unsigned int i, Object val) {
	if (i < v->cnt) {
		if (i >= tailoff(v)) {
			ObjectArray newTail = new_object_array(v->tail->size());
			*newTail = *v->tail;
			(*newTail)[i & 0x01f] = val;
			return Vector(new _Vector {v->cnt, v->shift, v->root, newTail});
		}
		return Vector(new _Vector {v->cnt, v->shift, doAssoc(v->shift, v->root, i, val), v->tail});
	}
	if (i == v->cnt) return conj(v, val);
	throw RuntimeException("Index out of bounds");
}